

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vis_helper.c
# Opt level: O1

uint32_t helper_fpackfix(uint64_t gsr,uint64_t rs2)

{
  uint uVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  
  bVar2 = 0;
  lVar3 = 0;
  uVar1 = 0;
  do {
    lVar4 = ((long)(int)(rs2 >> (bVar2 & 0x3f)) << ((byte)(gsr >> 3) & 0x1f)) >> 0x10;
    if (0x7ffe < lVar4) {
      lVar4 = 0x7fff;
    }
    if (lVar4 < -0x7fff) {
      lVar4 = -0x8000;
    }
    uVar1 = uVar1 | ((uint)lVar4 & 0xffff) << ((byte)lVar3 & 0x1f);
    lVar3 = lVar3 + 0x10;
    bVar2 = bVar2 + 0x20;
  } while (lVar3 == 0x10);
  return uVar1;
}

Assistant:

uint32_t helper_fpackfix(uint64_t gsr, uint64_t rs2)
{
    int scale = (gsr >> 3) & 0x1f;
    uint32_t ret = 0;
    int word;

    for (word = 0; word < 2; word++) {
        uint32_t val;
        int32_t src = rs2 >> (word * 32);
        int64_t scaled = (int64_t)src << scale;
        int64_t from_fixed = scaled >> 16;

        val = (from_fixed < -32768 ? -32768 :
               from_fixed > 32767 ?  32767 : from_fixed);

        ret |= (val & 0xffff) << (word * 16);
    }

    return ret;
}